

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> __thiscall
Assimp::FIReader::create(FIReader *this,IOStream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  _Head_base<0UL,_unsigned_char_*,_false> data;
  undefined4 extraout_var_00;
  size_t sVar2;
  CFIReaderImpl *this_00;
  IOStream *_stream;
  CIrrXML_IOStreamReader *this_01;
  _func_int **pp_Var3;
  IrrXMLReader *pIVar4;
  pointer *__ptr;
  pointer __old_p;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_28;
  
  iVar1 = (*stream->_vptr_IOStream[6])(stream);
  pp_Var3 = (_func_int **)CONCAT44(extraout_var,iVar1);
  data._M_head_impl = (uchar *)operator_new__((ulong)pp_Var3);
  iVar1 = (*stream->_vptr_IOStream[2])(stream,data._M_head_impl,pp_Var3,1);
  if (CONCAT44(extraout_var_00,iVar1) != 1) {
    operator_delete__(data._M_head_impl);
    pp_Var3 = (_func_int **)0x0;
    data._M_head_impl = (uchar *)0x0;
  }
  sVar2 = parseMagic(data._M_head_impl,data._M_head_impl + (long)pp_Var3);
  if (sVar2 == 0) {
    _stream = (IOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    _stream->_vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_008969f0;
    _stream[1]._vptr_IOStream = (_func_int **)data._M_head_impl;
    _stream[2]._vptr_IOStream = pp_Var3;
    _stream[3]._vptr_IOStream = (_func_int **)0x0;
    *(undefined1 *)&_stream[4]._vptr_IOStream = 1;
    this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
    CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_01,_stream);
    pp_Var3 = (_func_int **)operator_new(0x10);
    pIVar4 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_01);
    *pp_Var3 = (_func_int *)&PTR__CXMLReaderImpl_0095e5e0;
    pp_Var3[1] = (_func_int *)pIVar4;
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = pp_Var3;
    (*(this_01->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_01);
    (*_stream->_vptr_IOStream[1])(_stream);
  }
  else {
    this_00 = (CFIReaderImpl *)operator_new(0x230);
    local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)data._M_head_impl;
    CFIReaderImpl::CFIReaderImpl
              (this_00,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_28,(size_t)pp_Var3);
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = (_func_int **)this_00
    ;
    if ((_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
        local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
      operator_delete__((void *)local_28._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
  }
  return (__uniq_ptr_data<Assimp::FIReader,_std::default_delete<Assimp::FIReader>,_true,_true>)
         (__uniq_ptr_data<Assimp::FIReader,_std::default_delete<Assimp::FIReader>,_true,_true>)this;
}

Assistant:

std::unique_ptr<FIReader> FIReader::create(IOStream *stream)
{
    size_t size;
    bool isFI;
    auto data = readFile(stream, size, isFI);
    if (isFI) {
        return std::unique_ptr<FIReader>(new CFIReaderImpl(std::move(data), size));
    }
    else {
        auto memios = std::unique_ptr<MemoryIOStream>(new MemoryIOStream(data.release(), size, true));
        auto callback = std::unique_ptr<CIrrXML_IOStreamReader>(new CIrrXML_IOStreamReader(memios.get()));
        return std::unique_ptr<FIReader>(new CXMLReaderImpl(std::unique_ptr<irr::io::IIrrXMLReader<char, irr::io::IXMLBase>>(createIrrXMLReader(callback.get()))));
    }
}